

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::Texture2DFilteringCase::init
          (Texture2DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *this_00;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Texture2D *pTVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  pointer ppTVar12;
  int levelNdx;
  bool bVar13;
  float fVar14;
  float fVar15;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float in_XMM1_Db;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vector<float,_4> VVar18;
  long local_138;
  RGBA local_130;
  RGBA local_12c;
  undefined1 local_128 [16];
  Vec4 cScale;
  Vec4 cBias;
  Vector<float,_4> local_e8;
  Vector<float,_4> local_d8;
  Vec4 gMin;
  Vec4 gMax;
  TextureFormatInfo fmtInfo;
  Vector<float,_4> local_50;
  tcu local_40 [16];
  
  this_00 = &this->m_textures;
  if ((this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,2);
    iVar3 = 2;
    while (bVar13 = iVar3 != 0, iVar3 = iVar3 + -1, bVar13) {
      pTVar5 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (pTVar5,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,
                 this->m_height);
      fmtInfo.valueMin.m_data._0_8_ = pTVar5;
      std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
                ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
                 (Texture2D **)&fmtInfo);
    }
    uVar8 = this->m_width;
    local_128._0_4_ = 1;
    if (((uVar8 & uVar8 - 1) == 0) && (uVar1 = this->m_height, (uVar1 & uVar1 - 1) == 0)) {
      if ((int)uVar1 < (int)uVar8) {
        uVar1 = uVar8;
      }
      uVar8 = 0x20;
      if (uVar1 != 0) {
        uVar8 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar8 = uVar8 ^ 0x1f;
      }
      local_128._0_4_ = 0x20 - uVar8;
    }
    tcu::getTextureFormatInfo
              (&fmtInfo,(TextureFormat *)
                        &(*(this_00->
                           super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                           _M_impl.super__Vector_impl_data._M_start)->m_refTexture);
    tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
    VVar18 = tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
    in_XMM1_Db = VVar18.m_data[3];
    uVar6 = (ulong)(uint)local_128._0_4_;
    lVar9 = 0;
    for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
      local_d8.m_data[0] = -0.5;
      local_d8.m_data[1] = -0.5;
      local_d8.m_data[2] = -0.5;
      local_d8.m_data[3] = 2.0;
      tcu::operator*((tcu *)&gMax,&local_d8,&cScale);
      tcu::operator+((tcu *)&gMin,(Vector<float,_4> *)&gMax,&cBias);
      local_e8.m_data[0] = 1.0;
      local_e8.m_data[1] = 1.0;
      local_e8.m_data[2] = 1.0;
      local_e8.m_data[3] = 0.0;
      tcu::operator*((tcu *)&local_d8,&local_e8,&cScale);
      VVar18 = tcu::operator+((tcu *)&gMax,&local_d8,&cBias);
      in_XMM1_Db = VVar18.m_data[3];
      tcu::Texture2D::allocLevel
                (&(*(this_00->
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)._M_impl
                    .super__Vector_impl_data._M_start)->m_refTexture,(int)uVar10);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 (*(long *)&((*(this_00->
                               super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                               )._M_impl.super__Vector_impl_data._M_start)->m_refTexture).
                            super_TextureLevelPyramid.m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl + lVar9),&gMin,&gMax);
      lVar9 = lVar9 + 0x28;
    }
    local_138 = 0;
    for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
      uVar2 = (ulong)(uint)local_128._0_4_;
      tcu::Texture2D::allocLevel
                (&(this_00->super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start[1]->m_refTexture,(int)uVar10);
      uVar8 = (int)(0xffffff / uVar2) * (int)uVar10;
      local_12c.m_value = uVar8 | 0xff000000;
      lVar9 = *(long *)&((this_00->
                         super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[1]->m_refTexture).
                        super_TextureLevelPyramid.m_access.
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl;
      tcu::RGBA::toVec(&local_12c);
      tcu::operator*((tcu *)&gMax,&local_d8,&cScale);
      tcu::operator+((tcu *)&gMin,&gMax,&cBias);
      local_130.m_value = ~uVar8 | 0xff000000;
      tcu::RGBA::toVec(&local_130);
      tcu::operator*(local_40,&local_50,&cScale);
      VVar18 = tcu::operator+((tcu *)&local_e8,(Vector<float,_4> *)local_40,&cBias);
      in_XMM1_Db = VVar18.m_data[3];
      tcu::fillWithGrid((PixelBufferAccess *)(lVar9 + local_138),4,&gMin,&local_e8);
      local_138 = local_138 + 0x28;
    }
    for (ppTVar12 = (this->m_textures).
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppTVar12 !=
        (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppTVar12 = ppTVar12 + 1) {
      (*(*ppTVar12)->_vptr_Texture2D[2])();
    }
  }
  else {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,1);
    fmtInfo.valueMin.m_data._0_8_ =
         glu::Texture2D::create
                   (this->m_renderCtx,this->m_renderCtxInfo,
                    ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive,
                    (int)((ulong)((long)(this->m_filenames).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_filenames).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5),
                    &this->m_filenames);
    std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
              ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
               (Texture2D **)&fmtInfo);
  }
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if (0x3f < iVar3) {
    iVar3 = 0x40;
  }
  iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 4);
  iVar7 = 0x40;
  if (iVar4 < 0x40) {
    iVar7 = iVar4;
  }
  for (lVar9 = 0xc; lVar9 != 0x5c; lVar9 = lVar9 + 0x14) {
    iVar4 = *(int *)(&UNK_01812164 + lVar9);
    iVar11 = (int)((ulong)((long)(this->m_textures).
                                 super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_textures).
                                super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    if (iVar4 < iVar11) {
      iVar11 = iVar4;
    }
    if (iVar4 < 0) {
      iVar11 = 0;
    }
    fVar15 = *(float *)(&UNK_0181216c + lVar9);
    fVar14 = deFloatExp2(*(float *)(&UNK_01812168 + lVar9));
    local_128 = ZEXT416((uint)((this->m_textures).
                               super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar11]->m_refTexture).
                              m_width);
    fVar15 = deFloatExp2(fVar15);
    pTVar5 = (this->m_textures).
             super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar11];
    cBias.m_data._0_8_ = *(undefined8 *)((long)&DAT_01812170 + lVar9);
    auVar16._0_4_ = fVar14 * (float)iVar3;
    auVar16._4_4_ = fVar15 * (float)iVar7;
    auVar16._8_4_ = extraout_XMM0_Db_00 * in_XMM1_Db;
    auVar16._12_4_ = extraout_XMM0_Db_01 * extraout_XMM0_Db;
    auVar17._4_4_ = (float)(pTVar5->m_refTexture).m_height;
    auVar17._0_4_ = (float)(int)local_128._0_4_;
    auVar17._8_4_ = (float)(int)local_128._4_4_;
    auVar17._12_4_ = 0;
    auVar17 = divps(auVar16,auVar17);
    cScale.m_data[0] = auVar17._0_4_ + cBias.m_data[0];
    cScale.m_data[1] = auVar17._4_4_ + cBias.m_data[1];
    FilterCase::FilterCase((FilterCase *)&fmtInfo,pTVar5,(Vec2 *)&cBias,(Vec2 *)&cScale);
    std::
    vector<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>
              (&this->m_cases,(FilterCase *)&fmtInfo);
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DFilteringCase::init (void)
{
	try
	{
		if (!m_filenames.empty())
		{
			m_textures.reserve(1);
			m_textures.push_back(glu::Texture2D::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size(), m_filenames));
		}
		else
		{
			// Create 2 textures.
			m_textures.reserve(2);
			for (int ndx = 0; ndx < 2; ndx++)
				m_textures.push_back(new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height));

			bool					mipmaps		= deIsPowerOfTwo32(m_width) && deIsPowerOfTwo32(m_height);
			int						numLevels	= mipmaps ? deLog2Floor32(de::max(m_width, m_height))+1 : 1;
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
			tcu::Vec4				cBias		= fmtInfo.valueMin;
			tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill first gradient texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				tcu::Vec4 gMin = tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
				tcu::Vec4 gMax = tcu::Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

				m_textures[0]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
			}

			// Fill second with grid texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / numLevels;
				deUint32	rgb		= step*levelNdx;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}

			// Upload.
			for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
				(*i)->upload();
		}

		// Compute cases.
		{
			const struct
			{
				int		texNdx;
				float	lodX;
				float	lodY;
				float	oX;
				float	oY;
			} cases[] =
			{
				{ 0,	1.6f,	2.9f,	-1.0f,	-2.7f	},
				{ 0,	-2.0f,	-1.35f,	-0.2f,	0.7f	},
				{ 1,	0.14f,	0.275f,	-1.5f,	-1.1f	},
				{ 1,	-0.92f,	-2.64f,	0.4f,	-0.1f	},
			};

			const float	viewportW	= (float)de::min<int>(VIEWPORT_WIDTH, m_renderCtx.getRenderTarget().getWidth());
			const float	viewportH	= (float)de::min<int>(VIEWPORT_HEIGHT, m_renderCtx.getRenderTarget().getHeight());

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int	texNdx	= de::clamp(cases[caseNdx].texNdx, 0, (int)m_textures.size()-1);
				const float	lodX	= cases[caseNdx].lodX;
				const float	lodY	= cases[caseNdx].lodY;
				const float	oX		= cases[caseNdx].oX;
				const float	oY		= cases[caseNdx].oY;
				const float	sX		= deFloatExp2(lodX)*viewportW / float(m_textures[texNdx]->getRefTexture().getWidth());
				const float	sY		= deFloatExp2(lodY)*viewportH / float(m_textures[texNdx]->getRefTexture().getHeight());

				m_cases.push_back(FilterCase(m_textures[texNdx], tcu::Vec2(oX, oY), tcu::Vec2(oX+sX, oY+sY)));
			}
		}

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DFilteringCase::deinit();
		throw;
	}
}